

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_superior_type
              (char *name,char *mod_name,lys_module *module,lys_node *parent,lys_tpdf **ret)

{
  lys_tpdf *plVar1;
  byte bVar2;
  ushort uVar3;
  LYS_NODE LVar4;
  lys_submodule *plVar5;
  int iVar6;
  char *name_00;
  long lVar7;
  ulong uVar8;
  lys_tpdf *plVar9;
  long lVar10;
  long lStack_60;
  
  if (mod_name == (char *)0x0) {
    lVar7 = 1;
    do {
      name_00 = (char *)0x0;
      if (lVar7 == 0x14) goto LAB_00114eed;
      plVar9 = ly_types[lVar7];
      iVar6 = strcmp(plVar9->name,name);
      lVar7 = lVar7 + 1;
    } while (iVar6 != 0);
  }
  else {
    iVar6 = strcmp(mod_name,module->name);
    name_00 = (char *)0x0;
    if (iVar6 != 0) {
      name_00 = mod_name;
    }
LAB_00114eed:
    if ((parent == (lys_node *)0x0) || (name_00 != (char *)0x0)) {
      module = lyp_get_module(module,(char *)0x0,0,name_00,0,0);
      if (module == (lys_module *)0x0) {
        return -1;
      }
    }
    else {
      for (; parent != (lys_node *)0x0; parent = lys_parent(parent)) {
        LVar4 = parent->nodetype;
        if (LVar4 == LYS_ACTION) {
LAB_00114f5e:
          uVar3 = *(ushort *)(parent->padding + 2);
          lStack_60 = 0x70;
LAB_00114f64:
          uVar8 = (ulong)uVar3;
LAB_00114f70:
          lVar7 = uVar8 + 1;
          plVar9 = (lys_tpdf *)(*(long *)(parent->padding + lStack_60 + -0x1c) + -0x80);
          while (lVar7 = lVar7 + -1, lVar7 != 0) {
            plVar1 = plVar9 + 1;
            plVar9 = plVar9 + 1;
            iVar6 = strcmp(plVar1->name,name);
            if (iVar6 == 0) goto LAB_00115004;
          }
        }
        else {
          if (LVar4 == LYS_LIST) {
            uVar8 = (ulong)parent->padding[1];
LAB_00114f6b:
            lStack_60 = 0x80;
            goto LAB_00114f70;
          }
          if ((LVar4 == LYS_NOTIF) || (LVar4 == LYS_RPC)) goto LAB_00114f5e;
          if (((LVar4 == LYS_INPUT) || (LVar4 == LYS_OUTPUT)) || (LVar4 == LYS_GROUPING)) {
            uVar3 = *(ushort *)(parent->padding + 2);
            lStack_60 = 0x68;
            goto LAB_00114f64;
          }
          if (LVar4 == LYS_CONTAINER) {
            uVar8 = (ulong)*(ushort *)(parent->padding + 2);
            goto LAB_00114f6b;
          }
        }
      }
    }
    uVar3 = module->tpdf_size;
    lVar7 = -0x80;
    do {
      lVar10 = lVar7 + 0x80;
      if ((ulong)uVar3 * 0x80 == lVar10) {
        bVar2 = module->inc_size;
        uVar8 = 0;
        do {
          if ((uVar8 == bVar2) ||
             (plVar5 = module->inc[uVar8].submodule, plVar5 == (lys_submodule *)0x0)) {
            return 1;
          }
          uVar3 = plVar5->tpdf_size;
          lVar7 = -0x80;
          while (lVar10 = lVar7 + 0x80, (ulong)uVar3 * 0x80 != lVar10) {
            plVar9 = plVar5->tpdf;
            iVar6 = strcmp(*(char **)(plVar9[1].padding + lVar7 + -0x1d),name);
            lVar7 = lVar10;
            if (iVar6 == 0) goto LAB_00115001;
          }
          uVar8 = uVar8 + 1;
        } while( true );
      }
      plVar9 = module->tpdf;
      iVar6 = strcmp(*(char **)(plVar9[1].padding + lVar7 + -0x1d),name);
      lVar7 = lVar10;
    } while (iVar6 != 0);
LAB_00115001:
    plVar9 = (lys_tpdf *)(plVar9->padding + lVar10 + -0x1d);
LAB_00115004:
    iVar6 = resolve_superior_type_check(&plVar9->type);
    if (iVar6 != 0) {
      return 1;
    }
  }
  if (ret != (lys_tpdf **)0x0) {
    *ret = plVar9;
  }
  return 0;
}

Assistant:

int
resolve_superior_type(const char *name, const char *mod_name, const struct lys_module *module,
                      const struct lys_node *parent, struct lys_tpdf **ret)
{
    int i, j;
    struct lys_tpdf *tpdf, *match;
    int tpdf_size;

    if (!mod_name) {
        /* no prefix, try built-in types */
        for (i = 1; i < LY_DATA_TYPE_COUNT; i++) {
            if (!strcmp(ly_types[i]->name, name)) {
                if (ret) {
                    *ret = ly_types[i];
                }
                return EXIT_SUCCESS;
            }
        }
    } else {
        if (!strcmp(mod_name, module->name)) {
            /* prefix refers to the current module, ignore it */
            mod_name = NULL;
        }
    }

    if (!mod_name && parent) {
        /* search in local typedefs */
        while (parent) {
            switch (parent->nodetype) {
            case LYS_CONTAINER:
                tpdf_size = ((struct lys_node_container *)parent)->tpdf_size;
                tpdf = ((struct lys_node_container *)parent)->tpdf;
                break;

            case LYS_LIST:
                tpdf_size = ((struct lys_node_list *)parent)->tpdf_size;
                tpdf = ((struct lys_node_list *)parent)->tpdf;
                break;

            case LYS_GROUPING:
                tpdf_size = ((struct lys_node_grp *)parent)->tpdf_size;
                tpdf = ((struct lys_node_grp *)parent)->tpdf;
                break;

            case LYS_RPC:
            case LYS_ACTION:
                tpdf_size = ((struct lys_node_rpc_action *)parent)->tpdf_size;
                tpdf = ((struct lys_node_rpc_action *)parent)->tpdf;
                break;

            case LYS_NOTIF:
                tpdf_size = ((struct lys_node_notif *)parent)->tpdf_size;
                tpdf = ((struct lys_node_notif *)parent)->tpdf;
                break;

            case LYS_INPUT:
            case LYS_OUTPUT:
                tpdf_size = ((struct lys_node_inout *)parent)->tpdf_size;
                tpdf = ((struct lys_node_inout *)parent)->tpdf;
                break;

            default:
                parent = lys_parent(parent);
                continue;
            }

            for (i = 0; i < tpdf_size; i++) {
                if (!strcmp(tpdf[i].name, name)) {
                    match = &tpdf[i];
                    goto check_typedef;
                }
            }

            parent = lys_parent(parent);
        }
    } else {
        /* get module where to search */
        module = lyp_get_module(module, NULL, 0, mod_name, 0, 0);
        if (!module) {
            return -1;
        }
    }

    /* search in top level typedefs */
    for (i = 0; i < module->tpdf_size; i++) {
        if (!strcmp(module->tpdf[i].name, name)) {
            match = &module->tpdf[i];
            goto check_typedef;
        }
    }

    /* search in submodules */
    for (i = 0; i < module->inc_size && module->inc[i].submodule; i++) {
        for (j = 0; j < module->inc[i].submodule->tpdf_size; j++) {
            if (!strcmp(module->inc[i].submodule->tpdf[j].name, name)) {
                match = &module->inc[i].submodule->tpdf[j];
                goto check_typedef;
            }
        }
    }

    return EXIT_FAILURE;

check_typedef:
    if (resolve_superior_type_check(&match->type)) {
        return EXIT_FAILURE;
    }

    if (ret) {
        *ret = match;
    }
    return EXIT_SUCCESS;
}